

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

bool __thiscall reflection::Service::KeyCompareLessThan(Service *this,Service *o)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  Service *pSVar8;
  
  if (*(ushort *)(this + -(long)*(int *)this) < 5) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)(this + (4 - (long)*(int *)this));
  }
  if (uVar4 == 0) {
    pSVar8 = (Service *)0x0;
  }
  else {
    pSVar8 = this + (ulong)*(uint *)(this + uVar4) + (ulong)uVar4;
  }
  if (*(ushort *)(o + -(long)*(int *)o) < 5) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)*(ushort *)(o + (4 - (long)*(int *)o));
  }
  uVar1 = *(uint *)pSVar8;
  uVar2 = *(uint *)(o + *(uint *)(o + uVar6) + uVar6);
  uVar3 = uVar1;
  if (uVar2 < uVar1) {
    uVar3 = uVar2;
  }
  iVar5 = memcmp(pSVar8 + 4,o + *(uint *)(o + uVar6) + uVar6 + 4,(ulong)uVar3);
  bVar7 = uVar1 < uVar2;
  if (iVar5 != 0) {
    bVar7 = iVar5 < 0;
  }
  return bVar7;
}

Assistant:

T ReadScalar(const void *p) {
  return EndianScalar(*reinterpret_cast<const T *>(p));
}